

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_SUB(void)

{
  bool bVar1;
  char cVar2;
  Z80Reg ZVar3;
  Z80Reg ZVar4;
  char **ppcVar5;
  int local_58 [10];
  
  do {
    local_58[4] = 0xffffffff;
    local_58[5] = -1;
    local_58[6] = -1;
    local_58[7] = -1;
    local_58[0] = -1;
    local_58[1] = -1;
    local_58[2] = -1;
    local_58[3] = -1;
    local_58[8] = 0xffffffff;
    ppcVar5 = (char **)0x90;
    bVar1 = CommonAluOpcode(0x90,local_58,true,true);
    if (!bVar1) {
      ZVar3 = GetRegister(ppcVar5);
      if (ZVar3 == Z80_UNK) {
        return;
      }
      ppcVar5 = &lp;
      bVar1 = comma(&lp);
      if (!bVar1) {
        Error("[SUB] Comma expected",(char *)0x0,PASS3);
        return;
      }
      ZVar4 = GetRegister(ppcVar5);
      if (ZVar3 == Z80_DE) {
        if (((uint)(ZVar4 << 0x1c | (uint)(ZVar4 + ~(Z80_I|Z80_A)) >> 4) < 4) &&
           (bVar1 = Options::noFakes(true), !bVar1)) {
          ZVar3 = ZVar4 ^ Z80_BC;
          if ((ZVar4 & ~Z80_BC) != Z80_DE) {
            ZVar3 = ZVar4;
          }
          local_58[0] = 0xb7;
          local_58[1] = -2;
          local_58[2] = 0xeb;
          local_58[3] = -2;
          local_58[4] = 0xed;
          local_58[5] = ZVar3 + LR35902_MEM_HL_D;
          local_58[6] = -2;
          local_58[7] = 0xeb;
        }
      }
      else if (((ZVar3 == Z80_HL) &&
               ((uint)(ZVar4 << 0x1c | (uint)(ZVar4 + ~(Z80_I|Z80_A)) >> 4) < 4)) &&
              (bVar1 = Options::noFakes(true), !bVar1)) {
        local_58[0] = 0xb7;
        local_58[1] = -2;
        local_58[3] = ZVar4 + LR35902_MEM_HL_D;
        local_58[2] = 0xed;
      }
    }
    EmitBytes(local_58,true);
    cVar2 = (*DAT_0018a520)(&lp);
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_SUB() {
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x90, e, true, true)) {	// handle common 8-bit variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[SUB] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				if (Z80_HL == reg) {			// fake sub hl,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						e[0] = 0xB7;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xed; e[3] = 0x32 + reg2;
						break;
					default: break;
					}
				} else if (Z80_DE == reg) {		// fake sub de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xB7;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0xEB;
						e[3] = INSTRUCTION_START_MARKER; e[4] = 0xED; e[5] = 0x32 + reg2ex;
						e[6] = INSTRUCTION_START_MARKER; e[7] = 0xEB;
						break;
					default: break;
					}
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}